

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O3

void * qp_pushpop_ptr(priority_queue *qp,wchar_t priority,void *payload)

{
  ulong uVar1;
  void *pvVar2;
  wchar_t wVar3;
  undefined4 uVar4;
  priority_queue_element *ppVar5;
  undefined4 in_register_00000034;
  
  if ((qp != (priority_queue *)0x0) && (uVar1 = qp->count, uVar1 <= qp->size)) {
    if ((uVar1 != 0) && (ppVar5 = qp->data, ppVar5->priority < priority)) {
      pvVar2 = (ppVar5->payload).p;
      if (ppVar5[uVar1 - 1].priority < priority) {
        wVar3 = ppVar5[uVar1 - 1].priority;
        uVar4 = *(undefined4 *)&ppVar5[uVar1 - 1].field_0xc;
        ppVar5->payload = ppVar5[uVar1 - 1].payload;
        ppVar5->priority = wVar3;
        *(undefined4 *)&ppVar5->field_0xc = uVar4;
        ppVar5 = qp->data + (qp->count - 1);
      }
      ppVar5->priority = priority;
      (ppVar5->payload).p = payload;
      down_heap(qp,CONCAT44(in_register_00000034,priority));
      payload = pvVar2;
    }
    return payload;
  }
  __assert_fail("qp && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0x1c5,"void *qp_pushpop_ptr(struct priority_queue *, int, void *)");
}

Assistant:

void *qp_pushpop_ptr(struct priority_queue *qp, int priority, void *payload)
{
	void *result;

	assert(qp && qp->count <= qp->size);
	if (qp->count == 0 || priority <= qp->data[0].priority) {
		result = payload;
	} else {
		result = qp->data[0].payload.p;
		if (priority <= qp->data[qp->count - 1].priority) {
			qp->data[0].priority = priority;
			qp->data[0].payload.p = payload;
		} else {
			qp->data[0] = qp->data[qp->count - 1];
			qp->data[qp->count - 1].priority = priority;
			qp->data[qp->count - 1].payload.p = payload;
		}
		down_heap(qp, 0);
	}

	return result;
}